

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

char * s3get_gvn_fattr(char *a)

{
  int iVar1;
  char *__s1;
  long lVar2;
  char **ppcVar3;
  
  if (attrib[0] == (char *)0x0) {
    lVar2 = 0;
  }
  else {
    ppcVar3 = value;
    lVar2 = 0;
    __s1 = attrib[0];
    do {
      iVar1 = strcmp(__s1,a);
      if (iVar1 == 0) {
        return *ppcVar3;
      }
      __s1 = attrib[lVar2 + 1];
      lVar2 = lVar2 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (__s1 != (char *)0x0);
  }
  if (value[lVar2] == (char *)0x0) {
    return (char *)0x0;
  }
  __assert_fail("(attrib[i] != NULL) || (value[i] == NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x5f,"char *s3get_gvn_fattr(char *)");
}

Assistant:

char *
s3get_gvn_fattr(char *a)
{
    int i;

    for (i = 0; attrib[i] && strcmp(attrib[i], a) != 0; i++);

    /* value for sentinel is null as well */
    assert((attrib[i] != NULL) || (value[i] == NULL));

    return value[i];
}